

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O3

void __thiscall ctemplate::TemplateCache::RefcountedTemplate::IncRef(RefcountedTemplate *this)

{
  int iVar1;
  MutexLock ml;
  MutexLock local_10;
  
  local_10.mu_ = &this->mutex_;
  if ((this->mutex_).is_safe_ == true) {
    iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)local_10.mu_);
    if (iVar1 != 0) {
      abort();
    }
  }
  if (0 < this->refcount_) {
    this->refcount_ = this->refcount_ + 1;
    MutexLock::~MutexLock(&local_10);
    return;
  }
  __assert_fail("refcount_ > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_cache.cc"
                ,0x5f,"void ctemplate::TemplateCache::RefcountedTemplate::IncRef()");
}

Assistant:

void IncRef() {
    MutexLock ml(&mutex_);
    assert(refcount_ > 0);
    ++refcount_;
  }